

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O1

from_chars_result
absl::from_chars(Nonnull<const_char_*> first,Nonnull<const_char_*> last,double *value,
                chars_format fmt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  uint64_t guess_mantissa;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  uint64_t uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  Nonnull<const_char_*> begin;
  bool negative;
  double dVar25;
  CalculatedFloat CVar26;
  from_chars_result fVar27;
  uint128 value_00;
  from_chars_result result;
  ParsedFloat hex_parse;
  from_chars_result local_78;
  ParsedFloat local_68;
  CalculatedFloat local_38;
  
  local_78.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  local_78.ptr = first;
  if (((((fmt & hex) == 0) && (1 < (long)last - (long)begin)) && (*begin == '0')) &&
     ((byte)(begin[1] | 0x20U) == 0x78)) {
    strings_internal::ParseFloat<16>(&local_68,begin + 2,last,fmt);
    if ((local_68.end != (Nonnull<const_char_*>)0x0) && (local_68.type == kNumber)) {
LAB_0011b30d:
      local_78.ptr = local_68.end;
      bVar11 = anon_unknown_0::HandleEdgeCase<double>(&local_68,negative,value);
      if (bVar11) goto LAB_0011b6d6;
      CVar26 = anon_unknown_0::CalculateFromParsedHexadecimal<double>(&local_68);
      local_38.mantissa = CVar26.mantissa;
      local_38.exponent = CVar26.exponent;
LAB_0011b6c9:
      anon_unknown_0::EncodeResult<double>(&local_38,negative,&local_78,value);
      goto LAB_0011b6d6;
    }
    if (fmt != scientific) {
      local_78.ptr = begin + 1;
      if (negative == false) {
        dVar25 = 0.0;
      }
      else {
        dVar25 = -0.0;
      }
      *value = dVar25;
      goto LAB_0011b6d6;
    }
  }
  else if ((fmt & hex) == 0) {
    strings_internal::ParseFloat<10>(&local_68,begin,last,fmt);
    if (local_68.end != (Nonnull<const_char_*>)0x0) {
      local_78.ptr = local_68.end;
      bVar11 = anon_unknown_0::HandleEdgeCase<double>(&local_68,negative,value);
      if (bVar11) goto LAB_0011b6d6;
      if ((Nonnull<bool_*>)local_68.subrange_begin == (Nonnull<bool_*>)0x0) {
        if (local_68.exponent < -0x156) {
          if (negative == false) {
            dVar25 = 0.0;
          }
          else {
            dVar25 = -0.0;
          }
        }
        else {
          if (local_68.exponent < 0x135) {
            if (local_68.mantissa == 0) {
              uVar20 = 0x40;
            }
            else {
              lVar14 = 0x3f;
              if (local_68.mantissa != 0) {
                for (; local_68.mantissa >> lVar14 == 0; lVar14 = lVar14 + -1) {
                }
              }
              uVar20 = (uint)lVar14 ^ 0x3f;
            }
            uVar12 = local_68.mantissa << ((byte)uVar20 & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar12;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                     (ulong)(local_68.exponent + 0x156) * 8);
            auVar3 = auVar3 * auVar6;
            if (CARRY8(auVar3._0_8_,uVar12) && (~auVar3._8_4_ & 0x1ff) == 0) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar12;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable +
                                       (ulong)(local_68.exponent + 0x156) * 8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = SUB168(auVar4 * auVar7,8);
              auVar3 = auVar3 + auVar10;
              if (((CARRY8(SUB168(auVar4 * auVar7,0),uVar12)) && (auVar3._0_8_ == -1)) &&
                 ((auVar3._8_4_ & 0x1ff) == 0x1ff)) goto LAB_0011b2e5;
            }
            uVar12 = auVar3._8_8_ >> (9U - (auVar3[0xf] >> 7) & 0x3f);
            uVar22 = (uint)uVar12;
            if ((auVar3._0_8_ != 0) ||
               ((uVar22 & 3) != 1 || (auVar3 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0)) {
              uVar12 = (uVar22 & 1) + uVar12;
              lVar14 = (((long)(int)(((local_68.exponent * 0x3526a >> 0x10) - uVar20) + 0x43f) -
                        (auVar3._8_8_ >> 0x3f ^ 1)) + 1) - (ulong)(uVar12 >> 0x36 == 0);
              if (0xfffffffffffff801 < lVar14 - 0x7ffU) {
                dVar18 = (double)(uVar12 >> 1 & 0xfffffffffffff | lVar14 << 0x34);
                dVar25 = (double)((ulong)dVar18 | 0x8000000000000000);
                if (negative == false) {
                  dVar25 = dVar18;
                }
                *value = dVar25;
                goto LAB_0011b6d6;
              }
            }
            goto LAB_0011b2e5;
          }
          if (negative == false) {
            dVar25 = 1.79769313486232e+308;
          }
          else {
            dVar25 = -1.79769313486232e+308;
          }
        }
        *value = dVar25;
        local_78.ec = result_out_of_range;
        goto LAB_0011b6d6;
      }
LAB_0011b2e5:
      if ((long)local_68.exponent < -0x156) {
        local_38.mantissa = 0;
        local_38.exponent = -99999;
      }
      else if (local_68.exponent < 0x135) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                 (long)local_68.exponent * 8 + 0xab0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_68.mantissa;
        auVar8 = auVar2 * auVar5;
        uVar15 = auVar8._8_8_;
        uVar12 = auVar8._0_8_;
        iVar24 = (local_68.exponent * 0x3526a >> 0x10) + -0x3f;
        if ((Nonnull<bool_*>)local_68.subrange_begin == (Nonnull<bool_*>)0x0) {
          if ((uint)local_68.exponent < 0x1c) {
            if (uVar15 == 0) {
              if (uVar12 == 0) {
                uVar20 = 0x40;
              }
              else {
                lVar14 = 0x3f;
                if (uVar12 != 0) {
                  for (; uVar12 >> lVar14 == 0; lVar14 = lVar14 + -1) {
                  }
                }
                uVar20 = (uint)lVar14 ^ 0x3f;
              }
              iVar21 = 0x40 - uVar20;
            }
            else {
              lVar14 = 0x3f;
              if (uVar15 != 0) {
                for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
                }
              }
              iVar21 = ((uint)lVar14 ^ 0xffffffc0) + 0x81;
            }
            bVar13 = 1;
          }
          else {
            lVar14 = 0x3f;
            if (uVar15 != 0) {
              for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
              }
            }
            if (uVar12 == 0) {
              uVar20 = 0x40;
            }
            else {
              lVar1 = 0x3f;
              if (uVar12 != 0) {
                for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              uVar20 = (uint)lVar1 ^ 0x3f;
            }
            uVar22 = (uint)lVar14 ^ 0x3f;
            if (uVar15 == 0) {
              uVar22 = uVar20;
            }
            iVar21 = (uint)(uVar15 != 0) * 0x40 - uVar22;
            uVar20 = iVar21 + 1;
            bVar13 = (byte)uVar20;
            bVar9 = bVar13 & 0x3f;
            uVar16 = uVar15 >> (bVar13 & 0x3f);
            bVar13 = 0;
            uVar17 = uVar16;
            uVar12 = uVar12 >> bVar9 | uVar15 << 0x40 - bVar9;
            if ((uVar20 & 0x40) != 0) {
              uVar17 = 0;
              uVar12 = uVar16;
            }
            auVar8._8_8_ = uVar17;
            auVar8._0_8_ = uVar12;
            iVar24 = iVar24 + iVar21 + 1;
            iVar21 = 0x3f;
          }
        }
        else {
          lVar14 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          if (uVar12 == 0) {
            uVar20 = 0x40;
          }
          else {
            lVar1 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar20 = (uint)lVar1 ^ 0x3f;
          }
          uVar22 = (uint)lVar14 ^ 0x3f;
          if (uVar15 == 0) {
            uVar22 = uVar20;
          }
          iVar21 = (uint)(uVar15 != 0) * 0x40 - uVar22;
          uVar20 = iVar21 + 6;
          bVar13 = (byte)uVar20;
          bVar9 = bVar13 & 0x3f;
          uVar16 = uVar15 >> (bVar13 & 0x3f);
          bVar13 = 0;
          uVar17 = uVar16;
          uVar12 = uVar12 >> bVar9 | uVar15 << 0x40 - bVar9;
          if ((uVar20 & 0x40) != 0) {
            uVar17 = 0;
            uVar12 = uVar16;
          }
          auVar8._8_8_ = uVar17;
          auVar8._0_8_ = uVar12;
          iVar24 = iVar24 + iVar21 + 6;
          iVar21 = 0x3a;
        }
        iVar23 = -0x432 - iVar24;
        if (-0x432 - iVar24 < iVar21 + -0x35) {
          iVar23 = iVar21 + -0x35;
        }
        value_00.hi_._0_4_ = iVar23;
        value_00.lo_ = auVar8._8_8_;
        value_00.hi_._4_4_ = 0;
        guess_mantissa =
             anon_unknown_0::ShiftRightAndRound
                       (auVar8._0_8_,value_00,(uint)bVar13,SUB81(&local_38,0),
                        (Nonnull<bool_*>)local_68.subrange_begin);
        if ((char)local_38.mantissa == '\0') {
          bVar11 = anon_unknown_0::MustRoundUp(guess_mantissa,iVar24 + iVar23,&local_68);
          guess_mantissa = guess_mantissa + bVar11;
        }
        uVar19 = 0x10000000000000;
        if (guess_mantissa != 0x20000000000000) {
          uVar19 = guess_mantissa;
        }
        iVar21 = iVar24 + iVar23 + (uint)(guess_mantissa == 0x20000000000000);
        iVar24 = -99999;
        if (uVar19 != 0) {
          iVar24 = iVar21;
        }
        local_38.mantissa = 0;
        local_38.exponent = 99999;
        if (iVar21 < 0x3cc) {
          local_38.mantissa = uVar19;
          local_38.exponent = iVar24;
        }
      }
      else {
        local_38.mantissa = 0;
        local_38.exponent = 99999;
      }
      goto LAB_0011b6c9;
    }
  }
  else {
    strings_internal::ParseFloat<16>(&local_68,begin,last,fmt);
    if (local_68.end != (Nonnull<const_char_*>)0x0) goto LAB_0011b30d;
  }
  local_78.ec = invalid_argument;
LAB_0011b6d6:
  fVar27.ec = local_78.ec;
  fVar27.ptr = local_78.ptr;
  fVar27._12_4_ = 0;
  return fVar27;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, double& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}